

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

qpdf_offset_t __thiscall
QPDFWriter::writeXRefStream
          (QPDFWriter *this,int xref_id,int max_id,qpdf_offset_t max_offset,trailer_e which,
          int first,int last,int size,qpdf_offset_t prev,int hint_id,qpdf_offset_t hint_offset,
          qpdf_offset_t hint_length,bool skip_compression,int linearization_pass)

{
  long lVar1;
  int iVar2;
  element_type *peVar3;
  uint *puVar4;
  longlong n;
  qpdf_offset_t offset_00;
  NewObject *pNVar5;
  unsigned_long_long uVar6;
  logic_error *this_00;
  unsigned_long __val;
  byte local_419;
  string_view local_418;
  string_view local_408;
  string_view local_3f8;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string_view local_328;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string_view local_258;
  string_view local_248;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  int local_108;
  int local_104;
  qpdf_offset_t local_100;
  qpdf_offset_t offset;
  QPDFXRefEntry *e;
  int i;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_e0;
  action_e local_d4;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_d0;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c8;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c0;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> link;
  undefined1 local_a8 [8];
  PipelinePopper pp_xref;
  undefined1 local_90 [7];
  bool compressed;
  string xref_data;
  qpdf_offset_t local_68;
  int local_60;
  uint local_54;
  uint local_50;
  uint esize;
  uint f2_size;
  uint local_44;
  long lStack_40;
  uint f1_size;
  qpdf_offset_t space_before_zero;
  qpdf_offset_t xref_offset;
  int local_28;
  trailer_e tStack_24;
  bool skip_compression_local;
  int first_local;
  trailer_e which_local;
  qpdf_offset_t max_offset_local;
  int max_id_local;
  int xref_id_local;
  QPDFWriter *this_local;
  
  xref_offset._7_1_ = skip_compression;
  local_28 = first;
  tStack_24 = which;
  _first_local = max_offset;
  max_offset_local._0_4_ = max_id;
  max_offset_local._4_4_ = xref_id;
  _max_id_local = this;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  space_before_zero = ::qpdf::pl::Count::getCount(peVar3->pipeline);
  lStack_40 = space_before_zero + -1;
  f2_size = bytesNeeded(this,_first_local + hint_length);
  esize = bytesNeeded(this,(long)(int)max_offset_local);
  puVar4 = std::max<unsigned_int>(&f2_size,&esize);
  local_44 = *puVar4;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  n = QIntC::to_longlong<unsigned_long>(&peVar3->max_ostream_index);
  local_50 = bytesNeeded(this,n);
  local_54 = local_44 + 1 + local_50;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  offset_00 = ::qpdf::pl::Count::getCount(peVar3->pipeline);
  QPDFXRefEntry::QPDFXRefEntry((QPDFXRefEntry *)((long)&xref_data.field_2 + 8),offset_00);
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pNVar5 = ObjTable<QPDFWriter::NewObject>::operator[]
                     (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                      max_offset_local._4_4_);
  *(undefined8 *)&pNVar5->xref = xref_data.field_2._8_8_;
  (pNVar5->xref).field1 = local_68;
  (pNVar5->xref).field2 = local_60;
  std::__cxx11::string::string((string *)local_90);
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_419 = 0;
  if ((peVar3->compress_streams & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_419 = peVar3->qdf_mode ^ 0xff;
  }
  pp_xref.stack_id._7_1_ = local_419 & 1;
  PipelinePopper::PipelinePopper((PipelinePopper *)local_a8,this);
  if ((pp_xref.stack_id._7_1_ & 1) == 0) {
    activatePipelineStack(this,(PipelinePopper *)local_a8,(string *)local_90);
  }
  else {
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    std::__cxx11::string::clear();
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
              ((pl *)&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    if ((xref_offset._7_1_ & 1) == 0) {
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::unique_ptr
                (&local_d0,&local_c0);
      local_d4 = a_deflate;
      ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>((pl *)&local_c8,&local_d0,&local_d4);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::operator=
                (&local_c0,&local_c8);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_c8);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_d0);
    }
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&i,&local_c0);
    e._4_4_ = 0;
    ::qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
              ((pl *)&local_e0,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&i,
               (action_e *)((long)&e + 4),&local_54);
    activatePipelineStack(this,(PipelinePopper *)local_a8,&local_e0);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_e0);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&i);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_c0);
  }
  e._0_4_ = local_28;
  do {
    if (last < (int)e) {
      PipelinePopper::~PipelinePopper((PipelinePopper *)local_a8);
      openObject(this,max_offset_local._4_4_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"<<");
      writeString(this,local_118);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"\n ");
      writeStringQDF(this,local_128);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138," /Type /XRef");
      writeString(this,local_138);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"\n ");
      writeStringQDF(this,local_148);
      __val = std::__cxx11::string::size();
      std::__cxx11::to_string(&local_198,__val);
      std::operator+(&local_178," /Length ",&local_198);
      local_158 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_178);
      writeString(this,local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      if ((pp_xref.stack_id._7_1_ & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"\n ");
        writeStringQDF(this,local_1a8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1b8," /Filter /FlateDecode");
        writeString(this,local_1b8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"\n ");
        writeStringQDF(this,local_1c8);
        std::__cxx11::to_string(&local_238,local_54);
        std::operator+(&local_218," /DecodeParms << /Columns ",&local_238);
        std::operator+(&local_1f8,&local_218," /Predictor 12 >>");
        local_1d8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8);
        writeString(this,local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"\n ");
      writeStringQDF(this,local_248);
      std::__cxx11::to_string(&local_2f8,local_44);
      std::operator+(&local_2d8," /W [ 1 ",&local_2f8);
      std::operator+(&local_2b8,&local_2d8," ");
      std::__cxx11::to_string(&local_318,local_50);
      std::operator+(&local_298,&local_2b8,&local_318);
      std::operator+(&local_278,&local_298," ]");
      local_258 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_278);
      writeString(this,local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      if ((local_28 != 0) || (last != size + -1)) {
        std::__cxx11::to_string(&local_3c8,local_28);
        std::operator+(&local_3a8," /Index [ ",&local_3c8);
        std::operator+(&local_388,&local_3a8," ");
        std::__cxx11::to_string(&local_3e8,(last - local_28) + 1);
        std::operator+(&local_368,&local_388,&local_3e8);
        std::operator+(&local_348,&local_368," ]");
        local_328 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_348);
        writeString(this,local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      writeTrailer(this,tStack_24,size,true,prev,linearization_pass);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3f8,"\nstream\n");
      writeString(this,local_3f8);
      local_408 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
      writeString(this,local_408);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_418,"\nendstream");
      writeString(this,local_418);
      closeObject(this,max_offset_local._4_4_);
      lVar1 = lStack_40;
      std::__cxx11::string::~string((string *)local_90);
      return lVar1;
    }
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    offset = (qpdf_offset_t)
             ObjTable<QPDFWriter::NewObject>::operator[]
                       (&(peVar3->new_obj).super_ObjTable<QPDFWriter::NewObject>,(int)e);
    iVar2 = QPDFXRefEntry::getType((QPDFXRefEntry *)offset);
    if (iVar2 == 0) {
      writeBinary(this,0,1);
      writeBinary(this,0,local_44);
      writeBinary(this,0,local_50);
    }
    else if (iVar2 == 1) {
      local_100 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)offset);
      if (((hint_id != 0) && ((int)e != hint_id)) && (hint_offset <= local_100)) {
        local_100 = hint_length + local_100;
      }
      writeBinary(this,1,1);
      uVar6 = QIntC::to_ulonglong<long_long>(&local_100);
      writeBinary(this,uVar6,local_44);
      writeBinary(this,0,local_50);
    }
    else {
      if (iVar2 != 2) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"invalid type writing xref stream");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      writeBinary(this,2,1);
      local_104 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)offset);
      uVar6 = QIntC::to_ulonglong<int>(&local_104);
      writeBinary(this,uVar6,local_44);
      local_108 = QPDFXRefEntry::getObjStreamIndex((QPDFXRefEntry *)offset);
      uVar6 = QIntC::to_ulonglong<int>(&local_108);
      writeBinary(this,uVar6,local_50);
    }
    e._0_4_ = (int)e + 1;
  } while( true );
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefStream(
    int xref_id,
    int max_id,
    qpdf_offset_t max_offset,
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    bool skip_compression,
    int linearization_pass)
{
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    qpdf_offset_t space_before_zero = xref_offset - 1;

    // field 1 contains offsets and object stream identifiers
    unsigned int f1_size = std::max(bytesNeeded(max_offset + hint_length), bytesNeeded(max_id));

    // field 2 contains object stream indices
    unsigned int f2_size = bytesNeeded(QIntC::to_longlong(m->max_ostream_index));

    unsigned int esize = 1 + f1_size + f2_size;

    // Must store in xref table in advance of writing the actual data rather than waiting for
    // openObject to do it.
    m->new_obj[xref_id].xref = QPDFXRefEntry(m->pipeline->getCount());

    std::string xref_data;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        PipelinePopper pp_xref(this);
        if (compressed) {
            m->count_buffer.clear();
            auto link = pl::create<pl::String>(xref_data);
            if (!skip_compression) {
                // Write the stream dictionary for compression but don't actually compress.  This
                // helps us with computation of padding for pass 1 of linearization.
                link = pl::create<Pl_Flate>(std::move(link), Pl_Flate::a_deflate);
            }
            activatePipelineStack(
                pp_xref, pl::create<Pl_PNGFilter>(std::move(link), Pl_PNGFilter::a_encode, esize));
        } else {
            activatePipelineStack(pp_xref, xref_data);
        }

        for (int i = first; i <= last; ++i) {
            QPDFXRefEntry& e = m->new_obj[i].xref;
            switch (e.getType()) {
            case 0:
                writeBinary(0, 1);
                writeBinary(0, f1_size);
                writeBinary(0, f2_size);
                break;

            case 1:
                {
                    qpdf_offset_t offset = e.getOffset();
                    if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                        offset += hint_length;
                    }
                    writeBinary(1, 1);
                    writeBinary(QIntC::to_ulonglong(offset), f1_size);
                    writeBinary(0, f2_size);
                }
                break;

            case 2:
                writeBinary(2, 1);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamNumber()), f1_size);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamIndex()), f2_size);
                break;

            default:
                throw std::logic_error("invalid type writing xref stream");
                break;
            }
        }
    }

    openObject(xref_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /XRef");
    writeStringQDF("\n ");
    writeString(" /Length " + std::to_string(xref_data.size()));
    if (compressed) {
        writeStringQDF("\n ");
        writeString(" /Filter /FlateDecode");
        writeStringQDF("\n ");
        writeString(" /DecodeParms << /Columns " + std::to_string(esize) + " /Predictor 12 >>");
    }
    writeStringQDF("\n ");
    writeString(" /W [ 1 " + std::to_string(f1_size) + " " + std::to_string(f2_size) + " ]");
    if (!((first == 0) && (last == size - 1))) {
        writeString(
            " /Index [ " + std::to_string(first) + " " + std::to_string(last - first + 1) + " ]");
    }
    writeTrailer(which, size, true, prev, linearization_pass);
    writeString("\nstream\n");
    writeString(xref_data);
    writeString("\nendstream");
    closeObject(xref_id);
    return space_before_zero;
}